

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *poVar7;
  size_t sVar8;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int iVar10;
  undefined8 uVar11;
  char flag;
  char buffer [256];
  byte local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  int local_1bc;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  do {
    sVar4 = read(this->read_fd_,&local_221,1);
    iVar2 = (int)sVar4;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        this->outcome_ = DIED;
        goto LAB_00138da5;
      }
      if (iVar2 == 1) {
        if (local_221 < 0x52) {
          if (local_221 == 0x49) {
            iVar2 = this->read_fd_;
            Message::Message((Message *)&local_198);
            goto LAB_00138f00;
          }
          if (local_221 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_00138da5;
          }
        }
        else {
          if (local_221 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_00138da5;
          }
          if (local_221 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_00138da5;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                           ,0x1eb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_00138da5;
      }
      break;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
  goto LAB_00138da5;
  while( true ) {
    piVar5 = __errno_location();
    iVar10 = *piVar5;
    if (iVar10 != 4) break;
LAB_00138f00:
    while( true ) {
      sVar4 = read(iVar2,local_138,0xff);
      uVar3 = (uint)sVar4;
      if ((int)uVar3 < 1) break;
      *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar3 & 0x7fffffff)) = 0;
      sVar8 = strlen((char *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198._M_dataplus._M_p + 0x10),(char *)local_138,sVar8);
    }
    if (uVar3 != 0xffffffff) {
      if (uVar3 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                           ,0x168);
        StringStreamToString(&local_220,(stringstream *)local_198._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
        goto LAB_0013902e;
      }
      piVar5 = __errno_location();
      iVar10 = *piVar5;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                     ,0x16b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
  GetLastErrnoDescription_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," [",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
LAB_0013902e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if ((stringstream *)local_198._M_dataplus._M_p != (stringstream *)0x0) {
    (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))(local_198._M_dataplus._M_p);
  }
LAB_00138da5:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"CHECK failed: File ","");
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_158,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                     );
  local_178._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == paVar9) {
    local_178.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_178._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_178,", line ");
  local_1e0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == paVar9) {
    local_1e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_1e0._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  local_1bc = 499;
  StreamableToString<int>(&local_1b8,&local_1bc);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    uVar11 = local_1e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_1b8._M_string_length + local_1e0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar11 = local_1b8.field_2._M_allocated_capacity;
    }
    if (local_1b8._M_string_length + local_1e0._M_string_length <= (ulong)uVar11) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1b8,0,0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      goto LAB_00139169;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1e0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
LAB_00139169:
  local_200._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p == paVar9) {
    local_200.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_200._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_200,": ");
  local_198._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p == paVar9) {
    local_198.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_198._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_198,"posix::Close(read_fd())");
  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar9) {
    local_220.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220," != -1");
  local_138[0]._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p == paVar9) {
    local_138[0].field_2._0_8_ = paVar9->_M_allocated_capacity;
    local_138[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = paVar9->_M_allocated_capacity;
  }
  local_138[0]._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    (**(code **)(local_158.field_2._M_allocated_capacity + 8))(paVar1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}